

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string_view cmQtAutoGen::GeneratorNameUpper(GenT genType)

{
  char *pcVar1;
  string_view sVar2;
  
  if (genType - MOC < 3) {
    pcVar1 = &DAT_005f2eb0 + *(int *)(&DAT_005f2eb0 + (ulong)(genType - MOC) * 4);
  }
  else {
    pcVar1 = "AUTOGEN";
  }
  sVar2._M_str = pcVar1;
  sVar2._M_len = 7;
  return sVar2;
}

Assistant:

cm::string_view cmQtAutoGen::GeneratorNameUpper(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return "AUTOGEN";
    case GenT::MOC:
      return "AUTOMOC";
    case GenT::UIC:
      return "AUTOUIC";
    case GenT::RCC:
      return "AUTORCC";
  }
  return "AUTOGEN";
}